

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getChessboardCorners
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *images,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *allFoundCorners,bool showResults)

{
  bool bVar1;
  byte bVar2;
  reference pMVar3;
  _InputArray local_110;
  allocator<char> local_f1;
  string local_f0 [32];
  _InputArray local_d0;
  Size_<int> local_b8;
  _InputOutputArray local_b0;
  _OutputArray local_98;
  Size_<int> local_7c [2];
  _InputArray local_68;
  byte local_49;
  undefined1 local_48 [7];
  bool found;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointBuf;
  __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> local_28;
  iterator iter;
  bool showResults_local;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *allFoundCorners_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *images_local;
  
  iter._M_current._7_1_ = showResults;
  local_28._M_current = (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(images);
  while( true ) {
    pointBuf.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end(images);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                        *)&pointBuf.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_48);
    pMVar3 = __gnu_cxx::
             __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
             operator*(&local_28);
    cv::_InputArray::_InputArray(&local_68,pMVar3);
    cv::Size_<int>::Size_(local_7c,&CHESSBOARD_DIMENSIONS);
    cv::_OutputArray::_OutputArray<cv::Point_<float>>
              (&local_98,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_48)
    ;
    bVar2 = cv::findChessboardCorners(&local_68,local_7c,&local_98,3);
    cv::_OutputArray::~_OutputArray(&local_98);
    cv::_InputArray::~_InputArray(&local_68);
    local_49 = bVar2 & 1;
    if (local_49 != 0) {
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::push_back(allFoundCorners,(value_type *)local_48);
    }
    if ((iter._M_current._7_1_ & 1) != 0) {
      pMVar3 = __gnu_cxx::
               __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
               operator*(&local_28);
      cv::_InputOutputArray::_InputOutputArray(&local_b0,pMVar3);
      cv::Size_<int>::Size_(&local_b8,&CHESSBOARD_DIMENSIONS);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_d0,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_48);
      cv::drawChessboardCorners(&local_b0,&local_b8,&local_d0,local_49 & 1);
      cv::_InputArray::~_InputArray(&local_d0);
      cv::_InputOutputArray::~_InputOutputArray(&local_b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f0,"Searching for Corners...",&local_f1);
      pMVar3 = __gnu_cxx::
               __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
               operator*(&local_28);
      cv::_InputArray::_InputArray(&local_110,pMVar3);
      cv::imshow(local_f0,&local_110);
      cv::_InputArray::~_InputArray(&local_110);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_48);
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&local_28,0);
  }
  return;
}

Assistant:

void getChessboardCorners(std::vector<cv::Mat> images, std::vector<std::vector<cv::Point2f>>& allFoundCorners, bool showResults = false)
{
    for (std::vector<cv::Mat>::iterator iter = images.begin(); iter != images.end(); iter++) {
        std::vector<cv::Point2f> pointBuf;
        bool found = findChessboardCorners(*iter, CHESSBOARD_DIMENSIONS, pointBuf, cv::CALIB_CB_ADAPTIVE_THRESH | cv::CALIB_CB_NORMALIZE_IMAGE);
        if (found) 
        {
            allFoundCorners.push_back(pointBuf);
        }
        if (showResults)
        {
            drawChessboardCorners(*iter, CHESSBOARD_DIMENSIONS, pointBuf, found);
            imshow("Searching for Corners...", *iter);
        }
    }
}